

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_push_promise_frame(nghttp2_session *session)

{
  int iVar1;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  int rv;
  nghttp2_session *session_local;
  
  iVar1 = nghttp2_frame_unpack_push_promise_payload
                    ((nghttp2_push_promise *)&session->iframe,(session->iframe).sbuf.pos);
  if (iVar1 == 0) {
    session_local._4_4_ = nghttp2_session_on_push_promise_received(session,&(session->iframe).frame)
    ;
  }
  else {
    session_local._4_4_ =
         nghttp2_session_terminate_session_with_reason(session,1,"PUSH_PROMISE: could not unpack");
  }
  return session_local._4_4_;
}

Assistant:

static int session_process_push_promise_frame(nghttp2_session *session) {
  int rv;
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;

  rv = nghttp2_frame_unpack_push_promise_payload(&frame->push_promise,
                                                 iframe->sbuf.pos);

  if (rv != 0) {
    return nghttp2_session_terminate_session_with_reason(
        session, NGHTTP2_PROTOCOL_ERROR, "PUSH_PROMISE: could not unpack");
  }

  return nghttp2_session_on_push_promise_received(session, frame);
}